

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_x_scanl.c
# Opt level: O0

void mgga_x_scanl_init(xc_func_type *p)

{
  undefined8 *in_RDI;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(int *)*in_RDI == 700) {
    xc_deorbitalize_init
              ((xc_func_type *)CONCAT44(700,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
               in_stack_ffffffffffffffe8);
  }
  else {
    if (*(int *)*in_RDI != 0x2bd) {
      fprintf(_stderr,"Internal error in mgga_x_scanl_init\n");
      exit(1);
    }
    xc_deorbitalize_init
              ((xc_func_type *)CONCAT44(0x2bd,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
               in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

static void
mgga_x_scanl_init(xc_func_type *p)
{
  switch(p->info->number){
  case(XC_MGGA_X_SCANL):
    xc_deorbitalize_init(p, XC_MGGA_X_SCAN, XC_MGGA_K_PC07_OPT);
    break;
  case(XC_MGGA_X_REVSCANL):
    xc_deorbitalize_init(p, XC_MGGA_X_REVSCAN, XC_MGGA_K_PC07_OPT);
    break;
  default:
    fprintf(stderr,"Internal error in mgga_x_scanl_init\n");
    exit(1);
  }
}